

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TSPStateImp.cpp
# Opt level: O0

vector<int,_std::allocator<int>_> * __thiscall
TSPStateImp::Neighbor(TSPStateImp *this,vector<int,_std::allocator<int>_> *currentState)

{
  bool bVar1;
  int iVar2;
  vector<int,_std::allocator<int>_> *this_00;
  reference piVar3;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_78;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_70;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> iter_2;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_60;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_58;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_48;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> iter_1;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_38;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_30;
  iterator iter;
  int v;
  int u;
  vector<int,_std::allocator<int>_> *newState;
  vector<int,_std::allocator<int>_> *currentState_local;
  TSPStateImp *this_local;
  
  this_00 = (vector<int,_std::allocator<int>_> *)operator_new(0x18);
  std::vector<int,_std::allocator<int>_>::vector(this_00);
  iVar2 = rand();
  iter._M_current._4_4_ = iVar2 % this->n;
  iVar2 = rand();
  iter._M_current._0_4_ = iVar2 % this->n;
  if ((int)iter._M_current < iter._M_current._4_4_) {
    std::swap<int>((int *)((long)&iter._M_current + 4),(int *)&iter);
  }
  local_30._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(currentState);
  while( true ) {
    iter_1._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(currentState);
    local_38 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&iter_1,(long)iter._M_current._4_4_);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_38);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_30);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_30);
  }
  local_50._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(currentState);
  local_48 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&local_50,(long)(int)iter._M_current);
  while( true ) {
    iter_2._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(currentState);
    local_60 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator+(&iter_2,(long)iter._M_current._4_4_);
    local_58 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator-(&local_60,1);
    bVar1 = __gnu_cxx::operator!=(&local_48,&local_58);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_48);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator--
              (&local_48);
  }
  local_80._M_current = (int *)std::vector<int,_std::allocator<int>_>::begin(currentState);
  local_78 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&local_80,(long)(int)iter._M_current);
  local_70 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator+
                       (&local_78,1);
  while( true ) {
    local_88._M_current = (int *)std::vector<int,_std::allocator<int>_>::end(currentState);
    bVar1 = __gnu_cxx::operator!=(&local_70,&local_88);
    if (!bVar1) break;
    piVar3 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&local_70);
    std::vector<int,_std::allocator<int>_>::push_back(this_00,piVar3);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_70);
  }
  return this_00;
}

Assistant:

std::vector<int> *TSPStateImp::Neighbor(std::vector<int> *currentState)
{
	std::vector<int> *newState = new std::vector<int>;

	int u = rand() % n, v = rand() % n;

	if (u > v)
	{
		std::swap(u, v);
	}

	for (auto iter = currentState->begin(); iter != currentState->begin() + u; ++iter)
	{
		newState->push_back(*iter);
	}

	for (auto iter = currentState->begin() + v; iter != currentState->begin() + u - 1; --iter)
	{
		newState->push_back(*iter);
	}

	for (auto iter = currentState->begin() + v + 1; iter != currentState->end(); ++iter)
	{
		newState->push_back(*iter);
	}

	return newState;
}